

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void sbs_compare(sbs_t *sbs)

{
  uint64_t *puVar1;
  uint uVar2;
  uint32_t *__ptr;
  uint64_t uVar3;
  uint32_t *ans;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t j;
  ulong uVar9;
  ulong uVar10;
  unsigned_long result;
  ulong uVar11;
  
  uVar11 = (ulong)sbs->size;
  if (uVar11 == 0) {
    uVar2 = 0;
  }
  else {
    uVar6 = 0;
    uVar2 = 0;
    do {
      for (uVar8 = sbs->words[uVar6]; uVar8 != 0; uVar8 = uVar8 & uVar8 - 1) {
        uVar2 = uVar2 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar11);
  }
  uVar6 = (ulong)uVar2;
  __ptr = (uint32_t *)calloc(1,uVar6 * 4);
  if (uVar11 != 0) {
    puVar1 = sbs->words;
    iVar4 = 0;
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar5 = puVar1[uVar8];
      uVar9 = 0;
      do {
        if ((uVar5 >> (uVar9 & 0x3f) & 1) != 0) {
          uVar10 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
          __ptr[uVar10] = iVar4 + (int)uVar9;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x40);
      uVar8 = uVar8 + 1;
      iVar4 = iVar4 + 0x40;
    } while (uVar8 != uVar11);
  }
  uVar3 = roaring_bitmap_get_cardinality(sbs->roaring);
  result = 1;
  ans = (uint32_t *)calloc(1,(uVar3 & 0xffffffff) << 2);
  roaring_bitmap_to_uint32_array(sbs->roaring,ans);
  if (uVar2 == (uint)uVar3) {
    if ((int)uVar2 < 1) goto LAB_00103eb6;
    if (*ans == *__ptr) {
      uVar8 = (ulong)((uint)uVar3 & 0x7fffffff);
      uVar11 = 1;
      do {
        uVar5 = uVar11;
        if (uVar8 == uVar5) break;
        uVar11 = uVar5 + 1;
      } while (ans[uVar5] == __ptr[uVar5]);
      result = 1;
      if (uVar8 <= uVar5) goto LAB_00103eb6;
      goto LAB_00103e46;
    }
    printf("Expected: ");
LAB_00103e69:
    uVar11 = 0;
    do {
      printf("%u ",(ulong)__ptr[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  else {
LAB_00103e46:
    printf("Expected: ");
    if (uVar6 != 0) goto LAB_00103e69;
  }
  putchar(10);
  result = 0;
  printf("Actual: ");
  roaring_bitmap_printf(sbs->roaring);
  putchar(10);
LAB_00103eb6:
  free(ans);
  free(__ptr);
  _assert_true(result,"ok",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x21c);
  return;
}

Assistant:

void sbs_compare(sbs_t *sbs) {
    uint32_t expected_cardinality = 0;
    for (uint32_t i = 0; i < sbs->size; i++) {
        uint64_t word = sbs->words[i];
        while (word != 0) {
            expected_cardinality += 1;
            word = word & (word - 1);
        }
    }
    uint32_t *expected_values =
        (uint32_t *)malloc(expected_cardinality * sizeof(uint32_t));
    memset(expected_values, 0, expected_cardinality * sizeof(uint32_t));
    for (uint32_t i = 0, dst = 0; i < sbs->size; i++) {
        for (uint32_t j = 0; j < 64; j++) {
            if ((sbs->words[i] & (UINT64_C(1) << j)) != 0) {
                expected_values[dst++] = i * 64 + j;
            }
        }
    }

    uint32_t actual_cardinality = roaring_bitmap_get_cardinality(sbs->roaring);
    uint32_t *actual_values =
        (uint32_t *)malloc(actual_cardinality * sizeof(uint32_t));
    memset(actual_values, 0, actual_cardinality * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(sbs->roaring, actual_values);

    bool ok = array_equals(actual_values, actual_cardinality, expected_values,
                           expected_cardinality);
    if (!ok) {
        printf("Expected: ");
        for (uint32_t i = 0; i < expected_cardinality; i++) {
            printf("%u ", expected_values[i]);
        }
        printf("\n");

        printf("Actual: ");
        roaring_bitmap_printf(sbs->roaring);
        printf("\n");
    }
    free(actual_values);
    free(expected_values);
    assert_true(ok);
}